

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O3

void __thiscall VulkanUtilities::VulkanInstance::VulkanInstance(VulkanInstance *this,CreateInfo *CI)

{
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *this_00;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *this_01;
  uint32_t *Args;
  VkInstance *ppVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer pVVar4;
  pointer ppcVar5;
  bool bVar6;
  VkResult VVar7;
  int iVar8;
  undefined4 uVar9;
  size_t sVar10;
  ostream *poVar11;
  char *pcVar12;
  char (*Args_1) [30];
  CreateInfo *pCVar13;
  VkExtensionProperties *Extension_1;
  pointer pVVar14;
  _Alloc_hider _Var15;
  VkLayerProperties *Layer;
  pointer pVVar16;
  pointer ppcVar17;
  ulong uVar18;
  char *in_R8;
  uint uVar19;
  pointer pVVar20;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *__range3;
  VkLayerProperties *Layer_2;
  VkExtensionProperties *Extension;
  pointer pVVar21;
  _Alloc_hider _Var22;
  VulkanInstance *pVVar23;
  uint32_t PhysicalDeviceCount;
  vector<const_char_*,_std::allocator<const_char_*>_> InstanceExtensions;
  char *LayerName;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  CreateInfo *local_258;
  undefined1 local_24c;
  undefined1 local_24b;
  undefined1 local_24a;
  undefined1 local_249;
  uint32_t LayerCount;
  uint uStack_244;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  char *local_228;
  char local_220 [4];
  uint local_21c;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range2;
  vector<const_char_*,_std::allocator<const_char_*>_> InstanceLayers;
  string msg;
  ios_base local_158 [272];
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *__range1;
  undefined4 local_40;
  undefined4 local_3c;
  char local_38 [4];
  uint local_34;
  
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanInstance>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanInstance>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_DebugMode = Disabled;
  this->m_pVkAllocator = CI->pVkAllocator;
  this->m_VkInstance = (VkInstance)0x0;
  this->m_VkVersion = 0x400000;
  this_00 = &this->m_Layers;
  __range2 = &this->m_Extensions;
  this_01 = &this->m_PhysicalDevices;
  (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_PhysicalDevices).
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_PhysicalDevices).
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_PhysicalDevices).
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258 = CI;
  VVar7 = volkInitialize();
  if (VVar7 != VK_SUCCESS) {
    in_R8 = "Failed to load Vulkan.";
    Diligent::LogError<true,char[23]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x103,(char (*) [23])"Failed to load Vulkan.");
  }
  _LayerCount = (pointer)((ulong)uStack_244 << 0x20);
  VVar7 = (*vkEnumerateInstanceLayerProperties)(&LayerCount,(VkLayerProperties *)0x0);
  if (VVar7 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VkResultToString(VVar7);
    in_R8 = "Failed to query layer count";
    Diligent::LogError<true,char[28],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x10c,(char (*) [28])"Failed to query layer count",
               (char (*) [17])"\nVK Error Code: ",(char **)&msg);
  }
  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::resize
            (this_00,(ulong)_LayerCount & 0xffffffff);
  (*vkEnumerateInstanceLayerProperties)
            (&LayerCount,
             (this_00->super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
             _M_impl.super__Vector_impl_data._M_start);
  if (VVar7 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VkResultToString(VVar7);
    in_R8 = "Failed to enumerate extensions";
    Diligent::LogError<true,char[31],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x10f,(char (*) [31])"Failed to enumerate extensions",
               (char (*) [17])"\nVK Error Code: ",(char **)&msg);
  }
  Args_1 = (char (*) [30])
           ((long)(this->m_Layers).
                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->m_Layers).
                  super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3);
  if ((long)Args_1 * 0xfc0fc0fc0fc0fc1 - ((ulong)_LayerCount & 0xffffffff) != 0) {
    Diligent::FormatString<char[26],char[30]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LayerCount == m_Layers.size()",Args_1);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_258->LogExtensions == true) {
    if ((this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Diligent::FormatString<char[32]>(&msg,(char (*) [32])"No Vulkan instance layers found");
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pVVar23 = this;
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      pVVar16 = (pVVar23->m_Layers).
                super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar4 = (pVVar23->m_Layers).
               super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pVVar16 != pVVar4) {
        paVar2 = &msg.field_2;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)paVar2->_M_local_buf,"\n    ",5);
          if (pVVar16 == (pointer)0x0) {
            std::ios::clear((int)paVar2 +
                            (int)*(undefined8 *)(msg.field_2._M_allocated_capacity - 0x18));
          }
          else {
            sVar10 = strlen(pVVar16->layerName);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)paVar2->_M_local_buf,pVVar16->layerName,sVar10);
          }
          LayerCount._0_1_ = 0x20;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)paVar2->_M_local_buf,(char *)&LayerCount,1);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          LayerCount._0_1_ = 0x2e;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)&LayerCount,1);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          LayerCount._0_1_ = 0x2e;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)&LayerCount,1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          pVVar16 = pVVar16 + 1;
        } while (pVVar16 != pVVar4);
      }
      std::__cxx11::stringbuf::str();
      Diligent::FormatString<char[35],std::__cxx11::string>
                ((string *)&LayerCount,(Diligent *)"Available Vulkan instance layers: ",
                 (char (*) [35])&LayerName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      this = pVVar23;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)LayerName != &local_268) {
        operator_delete(LayerName,local_268._M_allocated_capacity + 1);
        this = pVVar23;
      }
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,_LayerCount,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_LayerCount != &local_238) {
        operator_delete(_LayerCount,local_238._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
      std::ios_base::~ios_base(local_158);
    }
  }
  bVar6 = anon_unknown_1::EnumerateInstanceExtensions((char *)0x0,__range2);
  if (!bVar6) {
    in_R8 = "Failed to enumerate instance extensions";
    Diligent::LogError<true,char[40]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x12a,(char (*) [40])"Failed to enumerate instance extensions");
  }
  if (local_258->LogExtensions == true) {
    if ((this->m_Extensions).
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_Extensions).
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Diligent::FormatString<char[36]>(&msg,(char (*) [36])"No Vulkan instance extensions found");
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0);
      }
    }
    else {
      pVVar23 = this;
      PrintExtensionsList_abi_cxx11_
                ((string *)&LayerCount,(VulkanUtilities *)__range2,
                 (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1,
                 (size_t)this);
      Diligent::FormatString<char[39],std::__cxx11::string>
                (&msg,(Diligent *)"Supported Vulkan instance extensions: ",
                 (char (*) [39])&LayerCount,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      this = pVVar23;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_LayerCount != &local_238) {
        operator_delete(_LayerCount,local_238._M_allocated_capacity + 1);
        this = pVVar23;
      }
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar14 = (this->m_Extensions).
            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pVVar20 = (this->m_Extensions).
            super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pVVar21 = pVVar14;
  __range1 = this_00;
  if (pVVar14 != pVVar20) {
    do {
      iVar8 = strcmp(pVVar21->extensionName,"VK_KHR_surface");
      if (iVar8 == 0) {
        msg._M_dataplus._M_p = "VK_KHR_surface";
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                   (iterator)0x0,(char **)&msg);
        msg._M_dataplus._M_p = "VK_KHR_xlib_surface";
        if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                     (iterator)
                     InstanceExtensions.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,(char **)&msg);
        }
        else {
          *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = "VK_KHR_xlib_surface";
          InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_finish =
               InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        msg._M_dataplus._M_p = "VK_KHR_xcb_surface";
        if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                     (iterator)
                     InstanceExtensions.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,(char **)&msg);
        }
        else {
          *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = "VK_KHR_xcb_surface";
          InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_finish =
               InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pVVar14 = (this->m_Extensions).
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pVVar20 = (this->m_Extensions).
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        break;
      }
      pVVar21 = pVVar21 + 1;
    } while (pVVar21 != pVVar20);
    do {
      if (pVVar14 == pVVar20) break;
      iVar8 = strcmp(pVVar14->extensionName,"VK_KHR_get_physical_device_properties2");
      if (iVar8 == 0) {
        msg._M_dataplus._M_p = "VK_KHR_get_physical_device_properties2";
        if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                     (iterator)
                     InstanceExtensions.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,(char **)&msg);
        }
        else {
          *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = "VK_KHR_get_physical_device_properties2";
          InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
          .super__Vector_impl_data._M_finish =
               InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        break;
      }
      pVVar14 = pVVar14 + 1;
    } while( true );
  }
  ppcVar5 = InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar17 = InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      msg._M_dataplus._M_p = *ppcVar17;
      bVar6 = anon_unknown_1::IsExtensionAvailable(__range2,msg._M_dataplus._M_p);
      if (!bVar6) {
        in_R8 = "Required extension ";
        Diligent::LogError<true,char[20],char_const*,char[18]>
                  (false,"VulkanInstance",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                   ,0x162,(char (*) [20])"Required extension ",(char **)&msg,
                   (char (*) [18])" is not available");
      }
      ppcVar17 = ppcVar17 + 1;
    } while (ppcVar17 != ppcVar5);
  }
  Args = &local_258->ExtensionCount;
  if (local_258->ppExtensionNames == (char **)0x0) {
    if (local_258->ExtensionCount != 0) {
      Diligent::FormatString<char[61],unsigned_int,char[84]>
                (&msg,(Diligent *)"Global extensions pointer is null while extensions count is ",
                 (char (*) [61])Args,
                 (uint *)
                 ". Please initialize \'ppInstanceExtensionNames\' member of EngineVkCreateInfo struct."
                 ,(char (*) [84])in_R8);
      Diligent::DebugAssertionFailed
                (msg._M_dataplus._M_p,"VulkanInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                 ,0x176);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else if (local_258->ExtensionCount != 0) {
    uVar18 = 0;
    do {
      _LayerCount = local_258->ppExtensionNames[uVar18];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_LayerCount !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar6 = anon_unknown_1::IsExtensionAvailable(__range2,_LayerCount);
        if (bVar6) {
          if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                       (iterator)
                       InstanceExtensions.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,(char **)&LayerCount);
          }
          else {
            *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = _LayerCount;
            InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          Diligent::FormatString<char[11],char_const*,char[18]>
                    (&msg,(Diligent *)"Extension ",(char (*) [11])&LayerCount,
                     (char **)" is not available",(char (*) [18])in_R8);
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < *Args);
  }
  pCVar13 = local_258;
  uVar3 = local_258->ApiVersion;
  uVar19 = 0x400000;
  if (0x400000 < uVar3 && vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) {
    msg._M_dataplus._M_p = msg._M_dataplus._M_p & 0xffffffff00000000;
    (*vkEnumerateInstanceVersion)((uint32_t *)&msg);
    uVar19 = uVar3;
    if ((uint)msg._M_dataplus._M_p < uVar3) {
      uVar19 = (uint)msg._M_dataplus._M_p;
    }
  }
  pcVar12 = VulkanInstance::DeviceSimulationLayer;
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pCVar13->EnableDeviceSimulation == true) {
    pVVar4 = (this->m_Layers).
             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar16 = (this->m_Layers).
                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
                   .super__Vector_impl_data._M_start; pVVar16 != pVVar4; pVVar16 = pVVar16 + 1) {
      iVar8 = strcmp(pVVar16->layerName,pcVar12);
      if (iVar8 == 0) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&InstanceLayers,(iterator)0x0,
                   &VulkanInstance::DeviceSimulationLayer);
        break;
      }
    }
  }
  if (pCVar13->EnableValidation == true) {
    pVVar14 = (this->m_Extensions).
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar20 = (this->m_Extensions).
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pVVar21 = pVVar14;
    if (pVVar14 != pVVar20) {
      do {
        iVar8 = strcmp(pVVar21->extensionName,"VK_EXT_debug_utils");
        if (iVar8 == 0) {
          uVar9 = 1;
          goto LAB_0028bf0e;
        }
        pVVar21 = pVVar21 + 1;
      } while (pVVar21 != pVVar20);
LAB_0028bee5:
      iVar8 = strcmp(pVVar14->extensionName,"VK_EXT_debug_report");
      if (iVar8 != 0) goto code_r0x0028bef4;
      uVar9 = 2;
LAB_0028bf0e:
      *(undefined4 *)&this->m_DebugMode = uVar9;
    }
LAB_0028bf15:
    LayerName = "VK_LAYER_KHRONOS_validation";
    pVVar4 = (this->m_Layers).
             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar16 = (this->m_Layers).
                   super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
                   .super__Vector_impl_data._M_start; pVVar16 != pVVar4; pVVar16 = pVVar16 + 1) {
      iVar8 = strcmp(pVVar16->layerName,"VK_LAYER_KHRONOS_validation");
      if (iVar8 == 0) {
        uVar3 = pVVar16->specVersion;
        if (uVar3 < 0x404135) {
          in_R8 = (char *)&LayerCount;
          LayerCount = uVar3 >> 0x16;
          local_249 = 0x2e;
          PhysicalDeviceCount = uVar3 >> 0xc & 0x3ff;
          local_24a = 0x2e;
          local_34 = uVar3 & 0xfff;
          local_38[0] = '\x01';
          local_38[1] = '\0';
          local_38[2] = '\0';
          local_38[3] = '\0';
          local_24b = 0x2e;
          local_3c = 4;
          local_24c = 0x2e;
          local_40 = 0x135;
          Diligent::
          FormatString<char[8],char_const*,char[12],unsigned_int,char,unsigned_int,char,unsigned_int,char[36],unsigned_int,char,unsigned_int,char,unsigned_int,char[3]>
                    (&msg,(Diligent *)"Layer \'",(char (*) [8])&LayerName,(char **)"\' version (",
                     (char (*) [12])in_R8,(uint *)&local_249,(char *)&PhysicalDeviceCount,
                     (uint *)&local_24a,(char *)&local_34,
                     (uint *)") is less than the header version (",(char (*) [36])local_38,
                     (uint *)&local_24b,(char *)&local_3c,(uint *)&local_24c,(char *)&local_40,
                     (uint *)0x75ce90,(char (*) [3])this);
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
          }
          pCVar13 = local_258;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
        }
        if (InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&InstanceLayers,
                     (iterator)
                     InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&LayerName);
        }
        else {
          *InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_finish = LayerName;
          InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (*(int *)&this->m_DebugMode == 1) goto LAB_0028c1f8;
        _LayerCount = (pointer)0x0;
        paStack_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_238._M_allocated_capacity = 0;
        bVar6 = anon_unknown_1::EnumerateInstanceExtensions
                          (LayerName,
                           (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                           &LayerCount);
        paVar2 = paStack_240;
        _Var15._M_p = _LayerCount;
        if (bVar6) {
          _Var22._M_p = _LayerCount;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_LayerCount != paStack_240) goto LAB_0028c7de;
        }
        else {
          Diligent::FormatString<char[36],char_const*,char[7]>
                    (&msg,(Diligent *)"Failed to enumerate extensions for ",
                     (char (*) [36])&LayerName,(char **)" layer",(char (*) [7])in_R8);
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)Diligent::DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
          }
          _Var15._M_p = _LayerCount;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            _Var15._M_p = _LayerCount;
          }
        }
        goto LAB_0028c8aa;
      }
    }
    Diligent::FormatString<char[18],char_const*,char[19]>
              (&msg,(Diligent *)"Validation layer ",(char (*) [18])&LayerName,
               (char **)" is not available.",(char (*) [19])in_R8);
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char *)0x0;
      (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      uVar18 = msg.field_2._M_allocated_capacity + 1;
      _Var15._M_p = msg._M_dataplus._M_p;
      goto LAB_0028bfbd;
    }
    goto LAB_0028bfc2;
  }
  goto LAB_0028c230;
code_r0x0028bef4:
  pVVar14 = pVVar14 + 1;
  if (pVVar14 == pVVar20) goto LAB_0028bf15;
  goto LAB_0028bee5;
  while (_Var22._M_p = _Var22._M_p + 0x104,
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var22._M_p != paVar2) {
LAB_0028c7de:
    iVar8 = strcmp(_Var22._M_p,"VK_EXT_debug_utils");
    if (iVar8 == 0) {
      *(undefined4 *)&this->m_DebugMode = 1;
      goto LAB_0028c8aa;
    }
  }
  _Var22._M_p = _Var15._M_p;
  if (*(int *)&this->m_DebugMode == 0) {
    do {
      iVar8 = strcmp(_Var22._M_p,"VK_EXT_debug_report");
      if (iVar8 == 0) {
        *(undefined4 *)&this->m_DebugMode = 2;
        break;
      }
      _Var22._M_p = _Var22._M_p + 0x104;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var22._M_p != paVar2);
  }
LAB_0028c8aa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var15._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar18 = local_238._M_allocated_capacity - (long)_Var15._M_p;
LAB_0028bfbd:
    operator_delete(_Var15._M_p,uVar18);
  }
LAB_0028bfc2:
  if (*(int *)&this->m_DebugMode == 1) {
LAB_0028c1f8:
    pcVar12 = "VK_EXT_debug_utils";
    msg._M_dataplus._M_p = "VK_EXT_debug_utils";
    if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                 (iterator)
                 InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(char **)&msg);
    }
    else {
LAB_0028c213:
      *InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish = pcVar12;
      InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  else if (*(int *)&this->m_DebugMode == 2) {
    pcVar12 = "VK_EXT_debug_report";
    msg._M_dataplus._M_p = "VK_EXT_debug_report";
    if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_0028c213;
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
               (iterator)
               InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,(char **)&msg);
  }
  else {
    in_R8 = "VK_EXT_debug_report";
    Diligent::FormatString<char[9],char[19],char[6],char[20],char[117]>
              (&msg,(Diligent *)"Neither ",(char (*) [9])"VK_EXT_debug_utils",(char (*) [19])" nor "
               ,(char (*) [6])"VK_EXT_debug_report",
               (char (*) [20])
               " extension is available. Debug tools (validation layer message logging, performance markers, etc.) will be disabled."
               ,(char (*) [117])this);
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char *)0x0;
      (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0028c230:
  if ((pCVar13->ppEnabledLayerNames != (char **)0x0) && (pCVar13->EnabledLayerCount != 0)) {
    uVar18 = 0;
    do {
      pcVar12 = pCVar13->ppEnabledLayerNames[uVar18];
      _LayerCount = pcVar12;
      if (pcVar12 == (char *)0x0) goto LAB_0028c75a;
      pVVar4 = (this->m_Layers).
               super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pVVar16 = (this->m_Layers).
                     super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                     _M_impl.super__Vector_impl_data._M_start; pVVar16 != pVVar4;
          pVVar16 = pVVar16 + 1) {
        iVar8 = strcmp(pVVar16->layerName,pcVar12);
        if (iVar8 == 0) {
          if (InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&InstanceLayers,
                       (iterator)
                       InstanceLayers.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,(char **)&LayerCount);
          }
          else {
            *InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish = pcVar12;
            InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          goto LAB_0028c32a;
        }
      }
      Diligent::FormatString<char[16],char_const*,char[18]>
                (&msg,(Diligent *)"Instance layer ",(char (*) [16])&LayerCount,
                 (char **)" is not available",(char (*) [18])in_R8);
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
LAB_0028c32a:
      uVar18 = uVar18 + 1;
      pCVar13 = local_258;
    } while (uVar18 < local_258->EnabledLayerCount);
  }
  ppVVar1 = &this->m_VkInstance;
  local_238._M_allocated_capacity = 0;
  local_238._8_8_ = 0;
  _LayerCount = (char *)0x0;
  paStack_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_228 = "Diligent Engine";
  local_220[0] = '\b';
  local_220[1] = -0x18;
  local_220[2] = '\x03';
  local_220[3] = '\0';
  msg._M_string_length = 0;
  msg._M_dataplus._M_p = (pointer)0x1;
  msg.field_2._M_allocated_capacity = 0;
  msg.field_2._8_8_ = &LayerCount;
  local_21c = uVar19;
  VVar7 = (*vkCreateInstance)((VkInstanceCreateInfo *)&msg,this->m_pVkAllocator,ppVVar1);
  if (VVar7 != VK_SUCCESS) {
    LayerName = VkResultToString(VVar7);
    Diligent::LogError<true,char[33],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x221,(char (*) [33])"Failed to create Vulkan instance",
               (char (*) [17])"\nVK Error Code: ",&LayerName);
  }
  volkLoadInstance(*ppVVar1);
  ppcVar5 = (this->m_EnabledExtensions).
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar17 = (this->m_EnabledExtensions).
             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppcVar5 != (pointer)0x0) {
    operator_delete(ppcVar5,(long)ppcVar17 - (long)ppcVar5);
  }
  this->m_VkVersion = uVar19;
  if (*(int *)&this->m_DebugMode == 2) {
    bVar6 = SetupDebugReport(*ppVVar1,VK_DEBUG_REPORT_ERROR_BIT_EXT|
                                      VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT|
                                      VK_DEBUG_REPORT_WARNING_BIT_EXT,(void *)0x0);
    if (bVar6) goto LAB_0028c558;
    Diligent::FormatString<char[86]>
              ((string *)&LayerName,
               (char (*) [86])
               "Failed to initialize debug report. Validation layer message logging will be disabled."
              );
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      (*(code *)Diligent::DebugMessageCallback)(2,LayerName,0,0,0);
    }
  }
  else {
    if ((*(int *)&this->m_DebugMode != 1) ||
       (bVar6 = SetupDebugUtils(*ppVVar1,0x1100,7,local_258->IgnoreDebugMessageCount,
                                local_258->ppIgnoreDebugMessageNames,(void *)0x0), bVar6))
    goto LAB_0028c558;
    Diligent::FormatString<char[112]>
              ((string *)&LayerName,
               (char (*) [112])
               "Failed to initialize debug utils. Validation layer message logging, performance markers, etc. will be disabled."
              );
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      (*(code *)Diligent::DebugMessageCallback)(2,LayerName,0,0,0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)LayerName != &local_268) {
    operator_delete(LayerName,local_268._M_allocated_capacity + 1);
  }
LAB_0028c558:
  PhysicalDeviceCount = 0;
  VVar7 = (*vkEnumeratePhysicalDevices)(*ppVVar1,&PhysicalDeviceCount,(VkPhysicalDevice *)0x0);
  if (VVar7 != VK_SUCCESS) {
    LayerName = VkResultToString(VVar7);
    Diligent::LogError<false,char[36],char[12],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x247,(char (*) [36])"Failed to get physical device count",
               (char (*) [12])"\nVK Error: ",&LayerName);
    Diligent::FormatString<char[6]>((string *)&LayerName,(char (*) [6])0x6f7eed);
    Diligent::DebugAssertionFailed
              (LayerName,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x247);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)LayerName != &local_268) {
      operator_delete(LayerName,local_268._M_allocated_capacity + 1);
    }
  }
  if (PhysicalDeviceCount == 0) {
    Diligent::LogError<true,char[40]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x249,(char (*) [40])"No physical devices found on the system");
  }
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::resize
            (this_01,(ulong)PhysicalDeviceCount);
  VVar7 = (*vkEnumeratePhysicalDevices)
                    (*ppVVar1,&PhysicalDeviceCount,
                     (this_01->
                     super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  if (VVar7 != VK_SUCCESS) {
    LayerName = VkResultToString(VVar7);
    Diligent::LogError<false,char[37],char[12],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24e,(char (*) [37])"Failed to enumerate physical devices",
               (char (*) [12])"\nVK Error: ",&LayerName);
    Diligent::FormatString<char[6]>((string *)&LayerName,(char (*) [6])0x6f7eed);
    Diligent::DebugAssertionFailed
              (LayerName,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)LayerName != &local_268) {
      operator_delete(LayerName,local_268._M_allocated_capacity + 1);
    }
  }
  if ((char (*) [48])
      ((long)(this->m_PhysicalDevices).
             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)(this->m_PhysicalDevices).
             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl
             .super__Vector_impl_data._M_start >> 3) != (char (*) [48])(ulong)PhysicalDeviceCount) {
    Diligent::FormatString<char[26],char[48]>
              ((string *)&LayerName,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_PhysicalDevices.size() == PhysicalDeviceCount",
               (char (*) [48])(ulong)PhysicalDeviceCount);
    Diligent::DebugAssertionFailed
              (LayerName,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)LayerName != &local_268) {
      operator_delete(LayerName,local_268._M_allocated_capacity + 1);
    }
  }
  Diligent::GLSLangUtils::InitializeGlslang();
LAB_0028c75a:
  if (InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)InstanceLayers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)InstanceLayers.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(InstanceExtensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)InstanceExtensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)InstanceExtensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

VulkanInstance::VulkanInstance(const CreateInfo& CI) :
    m_pVkAllocator{CI.pVkAllocator}
{
#if DILIGENT_USE_VOLK
    if (volkInitialize() != VK_SUCCESS)
    {
        LOG_ERROR_AND_THROW("Failed to load Vulkan.");
    }
#endif

    {
        // Enumerate available layers
        uint32_t LayerCount = 0;

        auto res = vkEnumerateInstanceLayerProperties(&LayerCount, nullptr);
        CHECK_VK_ERROR_AND_THROW(res, "Failed to query layer count");
        m_Layers.resize(LayerCount);
        vkEnumerateInstanceLayerProperties(&LayerCount, m_Layers.data());
        CHECK_VK_ERROR_AND_THROW(res, "Failed to enumerate extensions");
        VERIFY_EXPR(LayerCount == m_Layers.size());
    }

    if (CI.LogExtensions)
    {
        if (!m_Layers.empty())
        {
            std::stringstream ss;
            for (const auto& Layer : m_Layers)
            {
                ss << "\n    "
                   << Layer.layerName << ' '
                   << VK_API_VERSION_MAJOR(Layer.specVersion) << '.'
                   << VK_API_VERSION_MINOR(Layer.specVersion) << '.'
                   << VK_API_VERSION_PATCH(Layer.specVersion);
            }
            LOG_INFO_MESSAGE("Available Vulkan instance layers: ", ss.str());
        }
        else
        {
            LOG_INFO_MESSAGE("No Vulkan instance layers found");
        }
    }

    // Enumerate available instance extensions
    if (!EnumerateInstanceExtensions(nullptr, m_Extensions))
        LOG_ERROR_AND_THROW("Failed to enumerate instance extensions");

    if (CI.LogExtensions)
    {
        if (!m_Extensions.empty())
            LOG_INFO_MESSAGE("Supported Vulkan instance extensions: ", PrintExtensionsList(m_Extensions, 1));
        else
            LOG_INFO_MESSAGE("No Vulkan instance extensions found");
    }

    std::vector<const char*> InstanceExtensions;
    if (IsExtensionAvailable(VK_KHR_SURFACE_EXTENSION_NAME))
    {
        InstanceExtensions.push_back(VK_KHR_SURFACE_EXTENSION_NAME);

        // Enable surface extensions depending on OS
#if defined(VK_USE_PLATFORM_WIN32_KHR)
        InstanceExtensions.push_back(VK_KHR_WIN32_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_ANDROID_KHR)
        InstanceExtensions.push_back(VK_KHR_ANDROID_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_WAYLAND_KHR)
        InstanceExtensions.push_back(VK_KHR_WAYLAND_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_XLIB_KHR)
        InstanceExtensions.push_back(VK_KHR_XLIB_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_XCB_KHR)
        InstanceExtensions.push_back(VK_KHR_XCB_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_METAL_EXT)
        InstanceExtensions.push_back(VK_EXT_METAL_SURFACE_EXTENSION_NAME);
#endif
    };

#if PLATFORM_MACOS
    // Beginning with the 1.3.216 Vulkan SDK, the Vulkan Loader is strictly
    // enforcing the new VK_KHR_PORTABILITY_subset extension.
    constexpr bool UsePortabilityEnumeartion = true;
#else
    constexpr bool UsePortabilityEnumeartion = false;
#endif

    if (UsePortabilityEnumeartion)
        InstanceExtensions.push_back(VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);

    // This extension added to core in 1.1, but current version is 1.0
    if (IsExtensionAvailable(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME))
    {
        InstanceExtensions.push_back(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    }

    for (const auto* ExtName : InstanceExtensions)
    {
        if (!IsExtensionAvailable(ExtName))
            LOG_ERROR_AND_THROW("Required extension ", ExtName, " is not available");
    }

    if (CI.ppExtensionNames != nullptr)
    {
        for (uint32_t ext = 0; ext < CI.ExtensionCount; ++ext)
        {
            const auto* ExtName = CI.ppExtensionNames[ext];
            if (ExtName == nullptr)
                continue;
            if (IsExtensionAvailable(ExtName))
                InstanceExtensions.push_back(ExtName);
            else
                LOG_WARNING_MESSAGE("Extension ", ExtName, " is not available");
        }
    }
    else
    {
        DEV_CHECK_ERR(CI.ExtensionCount == 0,
                      "Global extensions pointer is null while extensions count is ", CI.ExtensionCount,
                      ". Please initialize 'ppInstanceExtensionNames' member of EngineVkCreateInfo struct.");
    }

    uint32_t ApiVersion = CI.ApiVersion;
#if DILIGENT_USE_VOLK
    if (vkEnumerateInstanceVersion != nullptr && ApiVersion > VK_API_VERSION_1_0)
    {
        uint32_t MaxApiVersion = 0;
        vkEnumerateInstanceVersion(&MaxApiVersion);
        ApiVersion = std::min(ApiVersion, MaxApiVersion);
    }
    else
    {
        // Only Vulkan 1.0 is supported.
        ApiVersion = VK_API_VERSION_1_0;
    }
#else
    // Without Volk we can only use Vulkan 1.0
    ApiVersion = VK_API_VERSION_1_0;
#endif

#if DILIGENT_USE_OPENXR
    XrInstance                xrInstance            = XR_NULL_HANDLE;
    XrSystemId                xrSystemId            = XR_NULL_SYSTEM_ID;
    PFN_xrGetInstanceProcAddr xrGetInstanceProcAddr = nullptr;
    if (CI.XR.Instance != 0)
    {
        if (CI.XR.GetInstanceProcAddr == nullptr)
            LOG_ERROR_AND_THROW("xrGetInstanceProcAddr must not be null");

        static_assert(sizeof(XrInstance) == sizeof(CI.XR.Instance), "XrInstance size mismatch");
        memcpy(&xrInstance, &CI.XR.Instance, sizeof(XrInstance));
        static_assert(sizeof(XrSystemId) == sizeof(CI.XR.SystemId), "XrSystemId size mismatch");
        memcpy(&xrSystemId, &CI.XR.SystemId, sizeof(XrSystemId));
        xrGetInstanceProcAddr = reinterpret_cast<PFN_xrGetInstanceProcAddr>(CI.XR.GetInstanceProcAddr);
    }
    if (xrInstance != 0)
    {
        ApiVersion = GetRequiredOpenXRVulkanVersion(ApiVersion, xrInstance, xrSystemId, xrGetInstanceProcAddr);
    }
#endif

    std::vector<const char*> InstanceLayers;

    // Use VK_DEVSIM_FILENAME environment variable to define the simulation layer
    if (CI.EnableDeviceSimulation)
    {
        static const char* DeviceSimulationLayer = "VK_LAYER_LUNARG_device_simulation";

        uint32_t LayerVer = 0;
        if (IsLayerAvailable(DeviceSimulationLayer, LayerVer))
        {
            InstanceLayers.push_back(DeviceSimulationLayer);
        }
    }

    if (CI.EnableValidation)
    {
        if (IsExtensionAvailable(VK_EXT_DEBUG_UTILS_EXTENSION_NAME))
        {
            // Prefer VK_EXT_debug_utils
            m_DebugMode = DebugMode::Utils;
        }
        else if (IsExtensionAvailable(VK_EXT_DEBUG_REPORT_EXTENSION_NAME))
        {
            // If debug utils are unavailable (e.g. on Android), use VK_EXT_debug_report
            m_DebugMode = DebugMode::Report;
        }

        for (const auto* LayerName : ValidationLayerNames)
        {
            uint32_t LayerVer = ~0u;
            if (!IsLayerAvailable(LayerName, LayerVer))
            {
                LOG_WARNING_MESSAGE("Validation layer ", LayerName, " is not available.");
                continue;
            }

            // Beta extensions may vary and result in a crash.
            // New enums are not supported and may cause validation error.
            if (LayerVer < VK_HEADER_VERSION_COMPLETE)
            {
                LOG_WARNING_MESSAGE("Layer '", LayerName, "' version (", VK_API_VERSION_MAJOR(LayerVer), '.', VK_API_VERSION_MINOR(LayerVer), '.', VK_API_VERSION_PATCH(LayerVer),
                                    ") is less than the header version (",
                                    VK_API_VERSION_MAJOR(VK_HEADER_VERSION_COMPLETE), '.', VK_API_VERSION_MINOR(VK_HEADER_VERSION_COMPLETE), '.', VK_API_VERSION_PATCH(VK_HEADER_VERSION_COMPLETE),
                                    ").");
            }

            InstanceLayers.push_back(LayerName);

            if (m_DebugMode != DebugMode::Utils)
            {
                // On Android, VK_EXT_debug_utils extension may not be supported by the loader,
                // but supported by the layer.
                std::vector<VkExtensionProperties> LayerExtensions;
                if (EnumerateInstanceExtensions(LayerName, LayerExtensions))
                {
                    if (VulkanUtilities::IsExtensionAvailable(LayerExtensions, VK_EXT_DEBUG_UTILS_EXTENSION_NAME))
                        m_DebugMode = DebugMode::Utils;

                    if (m_DebugMode == DebugMode::Disabled && VulkanUtilities::IsExtensionAvailable(LayerExtensions, VK_EXT_DEBUG_REPORT_EXTENSION_NAME))
                        m_DebugMode = DebugMode::Report; // Resort to debug report
                }
                else
                {
                    LOG_ERROR_MESSAGE("Failed to enumerate extensions for ", LayerName, " layer");
                }
            }
        }


        if (m_DebugMode == DebugMode::Utils)
            InstanceExtensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);
        else if (m_DebugMode == DebugMode::Report)
            InstanceExtensions.push_back(VK_EXT_DEBUG_REPORT_EXTENSION_NAME);
        else
            LOG_WARNING_MESSAGE("Neither ", VK_EXT_DEBUG_UTILS_EXTENSION_NAME, " nor ", VK_EXT_DEBUG_REPORT_EXTENSION_NAME, " extension is available. Debug tools (validation layer message logging, performance markers, etc.) will be disabled.");
    }

    if (CI.ppEnabledLayerNames != nullptr)
    {
        for (size_t i = 0; i < CI.EnabledLayerCount; ++i)
        {
            const auto* LayerName = CI.ppEnabledLayerNames[i];
            if (LayerName == nullptr)
                return;
            uint32_t LayerVer = 0;
            if (IsLayerAvailable(LayerName, LayerVer))
                InstanceLayers.push_back(LayerName);
            else
                LOG_WARNING_MESSAGE("Instance layer ", LayerName, " is not available");
        }
    }

    VkApplicationInfo appInfo{};
    appInfo.sType              = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo.pNext              = nullptr; // Pointer to an extension-specific structure.
    appInfo.pApplicationName   = nullptr;
    appInfo.applicationVersion = 0; // Developer-supplied version number of the application
    appInfo.pEngineName        = "Diligent Engine";
    appInfo.engineVersion      = DILIGENT_API_VERSION; // Developer-supplied version number of the engine used to create the application.
    appInfo.apiVersion         = ApiVersion;

    VkInstanceCreateInfo InstanceCreateInfo{};
    InstanceCreateInfo.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    InstanceCreateInfo.pNext = nullptr; // Pointer to an extension-specific structure.
    InstanceCreateInfo.flags = 0;
    if (UsePortabilityEnumeartion)
    {
        // The instance will enumerate available Vulkan Portability-compliant physical
        // devices and groups in addition to the Vulkan physical devices and groups that
        // are enumerated by default.
        InstanceCreateInfo.flags |= VK_INSTANCE_CREATE_ENUMERATE_PORTABILITY_BIT_KHR;
    }
    InstanceCreateInfo.pApplicationInfo        = &appInfo;
    InstanceCreateInfo.enabledExtensionCount   = static_cast<uint32_t>(InstanceExtensions.size());
    InstanceCreateInfo.ppEnabledExtensionNames = InstanceExtensions.empty() ? nullptr : InstanceExtensions.data();
    InstanceCreateInfo.enabledLayerCount       = static_cast<uint32_t>(InstanceLayers.size());
    InstanceCreateInfo.ppEnabledLayerNames     = InstanceLayers.empty() ? nullptr : InstanceLayers.data();

    VkResult res = VK_ERROR_UNKNOWN;
#if DILIGENT_USE_OPENXR
    if (xrInstance != XR_NULL_HANDLE)
    {
        res = CreateVkInstanceForOpenXR(xrInstance, xrSystemId, xrGetInstanceProcAddr, &InstanceCreateInfo, m_pVkAllocator, &m_VkInstance);
    }
    else
#endif
    {
        res = vkCreateInstance(&InstanceCreateInfo, m_pVkAllocator, &m_VkInstance);
    }
    CHECK_VK_ERROR_AND_THROW(res, "Failed to create Vulkan instance");

#if DILIGENT_USE_VOLK
    volkLoadInstance(m_VkInstance);
#endif

    m_EnabledExtensions = std::move(InstanceExtensions);
    m_VkVersion         = ApiVersion;

    // If requested, we enable the default validation layers for debugging
    if (m_DebugMode == DebugMode::Utils)
    {
        constexpr VkDebugUtilsMessageSeverityFlagsEXT messageSeverity =
            VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT;
        constexpr VkDebugUtilsMessageTypeFlagsEXT messageType =
            VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT;
        if (!VulkanUtilities::SetupDebugUtils(m_VkInstance, messageSeverity, messageType, CI.IgnoreDebugMessageCount, CI.ppIgnoreDebugMessageNames, nullptr))
            LOG_ERROR_MESSAGE("Failed to initialize debug utils. Validation layer message logging, performance markers, etc. will be disabled.");
    }
    else if (m_DebugMode == DebugMode::Report)
    {
        constexpr VkDebugReportFlagBitsEXT flags = static_cast<VkDebugReportFlagBitsEXT>(
            VK_DEBUG_REPORT_WARNING_BIT_EXT |
            VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT |
            VK_DEBUG_REPORT_ERROR_BIT_EXT);
        if (!VulkanUtilities::SetupDebugReport(m_VkInstance, flags, nullptr))
            LOG_ERROR_MESSAGE("Failed to initialize debug report. Validation layer message logging will be disabled.");
    }

    // Enumerate physical devices
    {
        // Physical device
        uint32_t PhysicalDeviceCount = 0;
        // Get the number of available physical devices
        auto err = vkEnumeratePhysicalDevices(m_VkInstance, &PhysicalDeviceCount, nullptr);
        CHECK_VK_ERROR(err, "Failed to get physical device count");
        if (PhysicalDeviceCount == 0)
            LOG_ERROR_AND_THROW("No physical devices found on the system");

        // Enumerate devices
        m_PhysicalDevices.resize(PhysicalDeviceCount);
        err = vkEnumeratePhysicalDevices(m_VkInstance, &PhysicalDeviceCount, m_PhysicalDevices.data());
        CHECK_VK_ERROR(err, "Failed to enumerate physical devices");
        VERIFY_EXPR(m_PhysicalDevices.size() == PhysicalDeviceCount);
    }
#if !DILIGENT_NO_GLSLANG
    Diligent::GLSLangUtils::InitializeGlslang();
#endif
}